

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Matrix * __thiscall Matrix::GetTranspose(Matrix *__return_storage_ptr__,Matrix *this)

{
  Fraction *pFVar1;
  Fraction *pFVar2;
  int j;
  int i;
  
  j = 0;
  Matrix(__return_storage_ptr__,this->m_,this->n_,0);
  if (0 < this->m_) {
    do {
      if (0 < this->n_) {
        i = 0;
        do {
          pFVar1 = At(this,i,j);
          pFVar2 = At(__return_storage_ptr__,j,i);
          *pFVar2 = *pFVar1;
          i = i + 1;
        } while (i < this->n_);
      }
      j = j + 1;
    } while (j < this->m_);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Matrix::GetTranspose() const {
  Matrix result(m_, n_);
  for (int i = 0; i < m_; ++i) {
    for (int j = 0; j < n_; ++j) {
      result.At(i, j) = At(j, i);
    }
  }

  return result;
}